

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileSwitch(jx9_gen_state *pGen)

{
  sxu32 sVar1;
  SyToken *pSVar2;
  jx9_vm *pVm;
  GenBlock *pBlock;
  int iVar3;
  sxi32 sVar4;
  SySet *pSet;
  ulong uVar5;
  SyToken *pSVar6;
  SyToken *pSVar7;
  sxu32 *pBlockStart;
  char cVar8;
  SyToken *pSVar9;
  GenBlock *pSwitchBlock;
  jx9_case_expr sCase;
  GenBlock *local_68;
  jx9_case_expr local_60;
  
  pSVar2 = pGen->pIn;
  sVar1 = pSVar2->nLine;
  pGen->pIn = pSVar2 + 1;
  if ((pSVar2 + 1 < pGen->pEnd) && ((pSVar2[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar2 + 2;
    sVar4 = GenStateEnterBlock(pGen,0x101,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_68);
    if (sVar4 != 0) {
      return -10;
    }
    pSVar2 = pGen->pIn;
    pSVar6 = pGen->pEnd;
    pSVar9 = pSVar2;
    if (pSVar2 < pSVar6) {
      iVar3 = 1;
      do {
        if ((pSVar9->nType >> 9 & 1) == 0) {
          if ((pSVar9->nType >> 10 & 1) != 0) {
            if (iVar3 < 2) break;
            iVar3 = iVar3 + -1;
          }
        }
        else {
          iVar3 = iVar3 + 1;
        }
        pSVar9 = pSVar9 + 1;
      } while (pSVar9 < pSVar6);
    }
    if ((pSVar2 == pSVar9 || pSVar6 <= pSVar9) &&
       (sVar4 = jx9GenCompileError(pGen,1,sVar1,"Expected expression after \'switch\' keyword"),
       sVar4 == -10)) {
      return -10;
    }
    pSVar2 = pGen->pEnd;
    pGen->pEnd = pSVar9;
    sVar4 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar4 == -10) {
      return -10;
    }
    pSVar6 = pGen->pIn;
    while (pSVar6 < pSVar9) {
      sVar4 = jx9GenCompileError(pGen,1,pSVar6->nLine,"Switch: Unexpected token \'%z\'");
      if (sVar4 == -10) {
        return -10;
      }
      pSVar6 = pGen->pIn + 1;
      pGen->pIn = pSVar6;
    }
    pSVar6 = pSVar9 + 1;
    pGen->pIn = pSVar6;
    pGen->pEnd = pSVar2;
    pSVar7 = pSVar9;
    if (((pSVar6 < pSVar2) && (pSVar7 = pSVar6, pSVar9 + 2 < pSVar2)) &&
       ((pSVar9[1].nType & 0x100040) != 0)) {
      pGen->pIn = pSVar9 + 2;
      pSet = (SySet *)SyMemBackendAlloc(&pGen->pVm->sAllocator,0x30);
      if (pSet == (SySet *)0x0) {
        jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
        return -10;
      }
      uVar5 = 0xfffffffffffffffc;
      do {
        *(undefined4 *)((long)&pSet->pAllocator + uVar5 + 4) = 0;
        uVar5 = uVar5 + 4;
      } while (uVar5 < 0x2c);
      pVm = pGen->pVm;
      pSet->nSize = 0;
      pSet->eSize = 0x30;
      pSet->nUsed = 0;
      pSet->nCursor = 0;
      pSet->pAllocator = &pVm->sAllocator;
      pSet->pBase = (void *)0x0;
      pSet->pUserData = (void *)0x0;
      jx9VmEmitInstr(pVm,0x45,0,0,pSet,(sxu32 *)0x0);
      pBlockStart = (sxu32 *)((long)&pSet[1].pAllocator + 4);
      do {
        pSVar2 = pGen->pIn;
        cVar8 = '\x05';
        if (pSVar2 < pGen->pEnd) {
          if ((pSVar2->nType & 4) == 0) {
            if (-1 < (char)pSVar2->nType) {
              sVar4 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Switch: Unexpected token \'%z\'");
              cVar8 = '\x01';
              if (sVar4 == -10) goto LAB_0012729d;
            }
            cVar8 = '\x05';
          }
          else if (*(int *)&pSVar2->pUserData == 5) {
            pGen->pIn = pSVar2 + 1;
            local_60.aByteCode.pAllocator = &pGen->pVm->sAllocator;
            local_60.aByteCode.nSize = 0;
            local_60.aByteCode.eSize = 0x18;
            local_60.aByteCode.nUsed = 0;
            local_60.aByteCode.nCursor = 0;
            local_60.aByteCode.pBase = (void *)0x0;
            local_60.aByteCode.pUserData = (void *)0x0;
            sVar4 = GenStateCompileCaseExpr(pGen,&local_60);
            cVar8 = '\x01';
            if (sVar4 != -10) {
              iVar3 = GenStateCompileSwitchBlock(pGen,&local_60.nStart);
              SySetPut(pSet,&local_60);
              goto LAB_00127268;
            }
          }
          else if (*(int *)&pSVar2->pUserData == 10) {
            if (*pBlockStart != 0) {
              sVar4 = jx9GenCompileError(pGen,2,pSVar2->nLine,
                                         "Switch: \'default\' case already compiled");
              cVar8 = '\x01';
              if (sVar4 == -10) goto LAB_0012729d;
            }
            pGen->pIn = pGen->pIn + 1;
            iVar3 = GenStateCompileSwitchBlock(pGen,pBlockStart);
LAB_00127268:
            cVar8 = (iVar3 == -0x12) * '\x05';
            if (iVar3 == -10) {
              cVar8 = '\x01';
            }
          }
          else {
            sVar4 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Switch: Unexpected token \'%z\'");
            cVar8 = (sVar4 != -10) * '\x04' + '\x01';
          }
        }
LAB_0012729d:
        if (cVar8 != '\0') {
          if (cVar8 != '\x05') {
            return -10;
          }
          sVar1 = pGen->pVm->pByteContainer->nUsed;
          *(sxu32 *)&pSet[1].pAllocator = sVar1;
          GenStateFixJumps(local_68,-1,sVar1);
          pBlock = pGen->pCurrent;
          if (pBlock != (GenBlock *)0x0) {
            pGen->pCurrent = pBlock->pParent;
            GenStateFreeBlock(pBlock);
          }
          if (pGen->pEnd <= pGen->pIn) {
            return 0;
          }
          pGen->pIn = pGen->pIn + 1;
          return 0;
        }
      } while( true );
    }
    iVar3 = jx9GenCompileError(pGen,1,pSVar7->nLine,"Switch: Unexpected token \'%z\'");
  }
  else {
    iVar3 = jx9GenCompileError(pGen,1,sVar1,"Expected \'(\' after \'switch\' keyword");
  }
  sVar4 = -10;
  if (iVar3 != -10) {
    pSVar2 = pGen->pIn;
    while ((sVar4 = 0, pSVar2 < pGen->pEnd && (sVar4 = 0, (pSVar2->nType & 0x40000) == 0))) {
      pGen->pIn = pSVar2 + 1;
      pSVar2 = pSVar2 + 1;
    }
  }
  return sVar4;
}

Assistant:

static sxi32 jx9CompileSwitch(jx9_gen_state *pGen)
{
	GenBlock *pSwitchBlock;
	SyToken *pTmp, *pEnd;
	jx9_switch *pSwitch;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'switch' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	pEnd = 0; /* cc warning */
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP|GEN_BLOCK_SWITCH, 
		jx9VmInstrLength(pGen->pVm), 0, &pSwitchBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"Switch: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	if( pGen->pIn >= pGen->pEnd || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_COLON/*:*/)) == 0 ){
			pTmp = pGen->pIn;
			if( pTmp >= pGen->pEnd ){
				pTmp--;
			}
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pTmp->nLine, "Switch: Unexpected token '%z'", &pTmp->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++; /* Jump the leading curly braces/colons */
	/* Create the switch blocks container */
	pSwitch = (jx9_switch *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_switch));
	if( pSwitch == 0 ){
		/* Abort compilation */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pSwitch, sizeof(jx9_switch));
	/* Initialize fields */
	SySetInit(&pSwitch->aCaseExpr, &pGen->pVm->sAllocator, sizeof(jx9_case_expr));
	/* Emit the switch instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_SWITCH, 0, 0, pSwitch, 0);
	/* Compile case blocks */
	for(;;){
		sxu32 nKwrd;
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if(  (pGen->pIn->nType & JX9_TK_CCB /*}*/) == 0 ){
				/* Unexpected token */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				/* FALL THROUGH */
			}
			/* Block compiled */
			break;
		}
		/* Extract the keyword */
		nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( nKwrd == JX9_TKWRD_DEFAULT ){
			/*
			 * Accroding to the JX9 language reference manual
			 *  A special case is the default case. This case matches anything
			 *  that wasn't matched by the other cases.
			 */
			if( pSwitch->nDefault > 0 ){
				/* Default case already compiled */ 
				rc = jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Switch: 'default' case already compiled");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}
			pGen->pIn++; /* Jump the 'default' keyword */
			/* Compile the default block */
			rc = GenStateCompileSwitchBlock(pGen,&pSwitch->nDefault);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else if( nKwrd == JX9_TKWRD_CASE ){
			jx9_case_expr sCase;
			/* Standard case block */
			pGen->pIn++; /* Jump the 'case' keyword */
			/* initialize the structure */
			SySetInit(&sCase.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
			/* Compile the case expression */
			rc = GenStateCompileCaseExpr(pGen, &sCase);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			/* Compile the case block */
			rc = GenStateCompileSwitchBlock(pGen,&sCase.nStart);
			/* Insert in the switch container */
			SySetPut(&pSwitch->aCaseExpr, (const void *)&sCase);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else{
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
				&pGen->pIn->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
	}
	/* Fix all jumps now the destination is resolved */
	pSwitch->nOut = jx9VmInstrLength(pGen->pVm);
	GenStateFixJumps(pSwitchBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	if( pGen->pIn < pGen->pEnd ){
		/* Jump the trailing curly braces */
		pGen->pIn++;
	}
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}